

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Header.h
# Opt level: O2

int64_t __thiscall aeron::concurrent::logbuffer::Header::position(Header *this)

{
  int iVar1;
  int32_t iVar2;
  int32_t iVar3;
  
  iVar1 = this->m_offset;
  iVar2 = frameLength(this);
  iVar3 = termId(this);
  return (long)(int)(iVar1 + iVar2 + 0x1fU & 0xffffffe0) +
         ((long)iVar3 - (long)this->m_initialTermId << ((byte)this->m_positionBitsToShift & 0x3f));
}

Assistant:

inline std::int64_t position() const
    {
        const std::int32_t resultingOffset = util::BitUtil::align(termOffset() + frameLength(), FrameDescriptor::FRAME_ALIGNMENT);
        return LogBufferDescriptor::computePosition(termId(), resultingOffset, m_positionBitsToShift, m_initialTermId);
    }